

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::
compile_int_assign(statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
                   *this,typed_lvalue_expression_t *lvalue,typed_expression_t *rvalue)

{
  integer_t iVar1;
  expression_type_t eVar2;
  value_type_conflict2 local_98 [2];
  long local_88;
  long local_80;
  value_type_conflict2 local_78;
  vector<long,_std::allocator<long>_> *local_70;
  undefined1 local_68 [8];
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_compiler;
  undefined1 local_50 [8];
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  lvalue_compiler;
  undefined1 local_30 [8];
  variable_bounds_visitor_t bounds_visitor;
  typed_expression_t *rvalue_local;
  typed_lvalue_expression_t *lvalue_local;
  statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  bounds_visitor._8_8_ = rvalue;
  variable_bounds_visitor_t::variable_bounds_visitor_t((variable_bounds_visitor_t *)local_30);
  (**(code **)(*(long *)&lvalue->super_typed_expression_t + 0x30))
            (lvalue,(variable_bounds_visitor_t *)local_30);
  rvalue_compiler._bytecode_back_inserter.container = (this->_bytecode_back_inserter).container;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::lvalue_expression_compiler_t
            ((lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_50,rvalue_compiler._bytecode_back_inserter);
  local_70 = (this->_bytecode_back_inserter).container;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_68,(back_insert_iterator<std::vector<long,_std::allocator<long>_>_>)local_70);
  (**(code **)(*(long *)&lvalue->super_typed_expression_t + 0x30))(lvalue,local_50);
  (**(code **)(*(long *)bounds_visitor._8_8_ + 0x30))(bounds_visitor._8_8_,local_68);
  local_78 = 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_78);
  iVar1 = variable_bounds_visitor_t::min((variable_bounds_visitor_t *)local_30);
  local_80 = (long)iVar1;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_80);
  iVar1 = variable_bounds_visitor_t::max((variable_bounds_visitor_t *)local_30);
  local_88 = (long)iVar1;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,&local_88);
  eVar2 = typed_expression_t::type(&lvalue->super_typed_expression_t);
  if (eVar2 != EXPR_TYPE_LOCALINTLVALUE) {
    eVar2 = typed_expression_t::type(&lvalue->super_typed_expression_t);
    if (eVar2 != EXPR_TYPE_LOCALINTVAR) {
      local_98[0] = 7;
      std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
                (&this->_bytecode_back_inserter,local_98);
      goto LAB_001b6af9;
    }
  }
  local_98[1] = 0x1b;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (&this->_bytecode_back_inserter,local_98 + 1);
LAB_001b6af9:
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::~rvalue_expression_compiler_t
            ((rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_68);
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  ::~lvalue_expression_compiler_t
            ((lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
              *)local_50);
  variable_bounds_visitor_t::~variable_bounds_visitor_t((variable_bounds_visitor_t *)local_30);
  return;
}

Assistant:

void compile_int_assign(tchecker::typed_lvalue_expression_t const & lvalue, tchecker::typed_expression_t const & rvalue)
  {
    // Get lvalue bounds
    tchecker::details::variable_bounds_visitor_t bounds_visitor;
    lvalue.visit(bounds_visitor);

    // Write bytecode
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> lvalue_compiler(_bytecode_back_inserter);
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_compiler(_bytecode_back_inserter);

    lvalue.visit(lvalue_compiler);
    rvalue.visit(rvalue_compiler);
    _bytecode_back_inserter = tchecker::VM_FAILNOTIN;
    _bytecode_back_inserter = bounds_visitor.min();
    _bytecode_back_inserter = bounds_visitor.max();
    if (lvalue.type() == EXPR_TYPE_LOCALINTLVALUE || lvalue.type() == EXPR_TYPE_LOCALINTVAR)
      _bytecode_back_inserter = tchecker::VM_ASSIGN_FRAME;
    else
      _bytecode_back_inserter = tchecker::VM_ASSIGN;
  }